

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTransaction::AddTxIn
          (AbstractTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  wally_tx *tx;
  bool bVar1;
  int iVar2;
  CfdException *this_00;
  int ret;
  int local_7c;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteData local_40;
  
  tx = (wally_tx *)this->wally_tx_pointer_;
  Txid::GetData((ByteData *)local_78,txid);
  ByteData::GetBytes(&local_58,(ByteData *)local_78);
  if ((uchar *)local_78._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity - local_78._0_8_);
  }
  bVar1 = Script::IsEmpty(unlocking_script);
  if (bVar1) {
    iVar2 = wally_tx_add_raw_input
                      (tx,local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_58.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,index,sequence,(uchar *)0x0,0,
                       (wally_tx_witness_stack *)0x0,0);
    local_7c = iVar2;
  }
  else {
    Script::GetData(&local_40,unlocking_script);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,&local_40);
    if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = wally_tx_add_raw_input
                      (tx,local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_58.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,index,sequence,
                       (uchar *)local_78._0_8_,
                       CONCAT44(local_78._12_4_,local_78._8_4_) - local_78._0_8_,
                       (wally_tx_witness_stack *)0x0,0);
    local_7c = iVar2;
    if ((uchar *)local_78._0_8_ != (uchar *)0x0) {
      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity - local_78._0_8_);
    }
  }
  if (iVar2 == 0) {
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_78._0_8_ = "cfdcore_transaction_common.cpp";
  local_78._8_4_ = 0x17e;
  local_68._M_allocated_capacity = 0x612f69;
  logger::log<int&>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                    "wally_tx_add_raw_input NG[{}].",&local_7c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = &local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"txin add error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_78);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  int ret;
  if (unlocking_script.IsEmpty()) {
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence, NULL, 0,
        NULL, 0);
  } else {
    const std::vector<uint8_t> &script_data =
        unlocking_script.GetData().GetBytes();
    ret = wally_tx_add_raw_input(
        tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
        script_data.data(), script_data.size(), NULL, 0);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }
}